

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

BufferHandle * __thiscall
duckdb::StandardBufferManager::Allocate
          (BufferHandle *__return_storage_ptr__,StandardBufferManager *this,MemoryTag tag,
          idx_t block_size,bool can_destroy)

{
  uint64_t uVar1;
  undefined7 in_register_00000011;
  shared_ptr<duckdb::BlockHandle,_true> block;
  DatabaseInstance *local_38;
  
  uVar1 = GetTemporaryBlockHeaderSize(this);
  RegisterMemory((StandardBufferManager *)&stack0xffffffffffffffc0,(MemoryTag)this,
                 CONCAT71(in_register_00000011,tag) & 0xffffffff,block_size,SUB81(uVar1,0));
  Pin(__return_storage_ptr__,this,(shared_ptr<duckdb::BlockHandle,_true> *)&stack0xffffffffffffffc0)
  ;
  if (local_38 != (DatabaseInstance *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

BufferHandle StandardBufferManager::Allocate(MemoryTag tag, idx_t block_size, bool can_destroy) {
	auto block = AllocateTemporaryMemory(tag, block_size, can_destroy);

#ifdef DUCKDB_DEBUG_DESTROY_BLOCKS
	// Initialize the memory with garbage data
	WriteGarbageIntoBuffer(*block);
#endif
	return Pin(block);
}